

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall
helics::FederateState::updateDataForTimeReturn
          (FederateState *this,MessageProcessingResult result,Time nextTime,IterationRequest iterate
          )

{
  pointer pIVar1;
  pointer puVar2;
  TimeCoordinator *pTVar3;
  bool bVar4;
  Time newTime;
  baseType bVar5;
  pointer puVar6;
  handle hStack_40;
  
  this->mGrantCount = this->mGrantCount + 1;
  if (result == HALTED) {
    newTime.internalTimeCode = 0x7fffffffffffffff;
    (this->time_granted).internalTimeCode = 0x7fffffffffffffff;
    bVar5 = 0x7fffffffffffffff;
  }
  else {
    pTVar3 = (this->timeCoord)._M_t.
             super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
             .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
    newTime.internalTimeCode = (pTVar3->time_granted).internalTimeCode;
    (this->time_granted).internalTimeCode = newTime.internalTimeCode;
    bVar5 = (pTVar3->info).outputDelay.internalTimeCode + newTime.internalTimeCode;
  }
  (this->allowed_send_time).internalTimeCode = bVar5;
  this->iterating = result == ITERATING;
  if (iterate == NO_ITERATIONS) {
    if ((nextTime.internalTimeCode <= newTime.internalTimeCode) &&
       (this->wait_for_current_time != true)) {
      fillEventVectorUpTo(this,newTime);
      return;
    }
    pIVar1 = (this->events).
             super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->events).
        super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish != pIVar1) {
      (this->events).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = pIVar1;
    }
    gmlc::libguarded::
    shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::lock((handle *)&hStack_40,&(this->interfaceInformation).inputs);
    puVar2 = ((hStack_40.data)->dataStorage).
             super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = ((hStack_40.data)->dataStorage).
                  super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1)
    {
      bVar4 = InputInfo::updateTimeInclusive
                        ((InputInfo *)
                         (puVar6->_M_t).
                         super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                         .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,newTime)
      ;
      if (bVar4) {
        std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::push_back
                  (&this->events,
                   &(((puVar6->_M_t).
                      super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                      .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->id).
                    handle);
      }
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&hStack_40.m_handle_lock);
    pIVar1 = (this->eventMessages).
             super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->eventMessages).
        super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish != pIVar1) {
      (this->eventMessages).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = pIVar1;
    }
    gmlc::libguarded::
    shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::lock(&hStack_40,&(this->interfaceInformation).endpoints);
    puVar2 = ((hStack_40.data)->dataStorage).
             super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = ((hStack_40.data)->dataStorage).
                  super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1)
    {
      bVar4 = EndpointInfo::updateTimeInclusive
                        ((puVar6->_M_t).
                         super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                         .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,newTime)
      ;
      if (bVar4) {
        std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::push_back
                  (&this->eventMessages,
                   &(((puVar6->_M_t).
                      super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                      .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->id).
                    handle);
      }
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&hStack_40.m_handle_lock);
    return;
  }
  if (iterate != ITERATE_IF_NEEDED) {
    if (iterate == FORCE_ITERATION) {
      fillEventVectorNextIteration(this,newTime);
      return;
    }
    return;
  }
  if ((nextTime.internalTimeCode <= newTime.internalTimeCode) &&
     (this->wait_for_current_time != true)) {
    fillEventVectorUpTo(this,newTime);
    return;
  }
  pIVar1 = (this->events).
           super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->events).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pIVar1) {
    (this->events).
    super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pIVar1;
  }
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock((handle *)&hStack_40,&(this->interfaceInformation).inputs);
  puVar2 = ((hStack_40.data)->dataStorage).
           super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = ((hStack_40.data)->dataStorage).
                super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1) {
    bVar4 = InputInfo::updateTimeNextIteration
                      ((InputInfo *)
                       (puVar6->_M_t).
                       super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                       .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,newTime);
    if (bVar4) {
      std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::push_back
                (&this->events,
                 &(((puVar6->_M_t).
                    super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                    .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->id).handle)
      ;
    }
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&hStack_40.m_handle_lock);
  pIVar1 = (this->eventMessages).
           super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->eventMessages).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pIVar1) {
    (this->eventMessages).
    super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pIVar1;
  }
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock(&hStack_40,&(this->interfaceInformation).endpoints);
  puVar2 = ((hStack_40.data)->dataStorage).
           super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = ((hStack_40.data)->dataStorage).
                super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1) {
    bVar4 = EndpointInfo::updateTimeNextIteration
                      ((puVar6->_M_t).
                       super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                       .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,newTime);
    if (bVar4) {
      std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::push_back
                (&this->eventMessages,
                 &(((puVar6->_M_t).
                    super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                    .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->id).handle)
      ;
    }
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&hStack_40.m_handle_lock);
  return;
}

Assistant:

void FederateState::updateDataForTimeReturn(MessageProcessingResult result,
                                            Time nextTime,
                                            IterationRequest iterate)
{
    ++mGrantCount;
    if (result == MessageProcessingResult::HALTED) {
        time_granted = Time::maxVal();
        allowed_send_time = Time::maxVal();
        iterating = false;
    } else {
        time_granted = timeCoord->getGrantedTime();
        allowed_send_time = timeCoord->allowedSendTime();
        iterating = (result == MessageProcessingResult::ITERATING);
    }

    // now fill the event vector so external systems know what has been updated
    switch (iterate) {
        case IterationRequest::FORCE_ITERATION:
            fillEventVectorNextIteration(time_granted);
            break;
        case IterationRequest::ITERATE_IF_NEEDED:
            if (time_granted < nextTime || wait_for_current_time) {
                fillEventVectorNextIteration(time_granted);
            } else {
                fillEventVectorUpTo(time_granted);
            }
            break;
        case IterationRequest::NO_ITERATIONS:
            if (time_granted < nextTime || wait_for_current_time) {
                fillEventVectorInclusive(time_granted);
            } else {
                fillEventVectorUpTo(time_granted);
            }
            break;
        default:
            break;
    }
}